

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int read_auth_file(mg_file *filep,read_auth_file_struct *workdata,int depth)

{
  char *__s;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ushort **ppuVar4;
  char *pcVar5;
  mg_file *filep_00;
  FILE *__stream;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar6;
  mg_file fp;
  char md5 [33];
  mg_file local_80;
  char local_58 [40];
  
  if ((((filep != (mg_file *)0x0) && (workdata != (read_auth_file_struct *)0x0)) && (depth != 0)) &&
     (__stream = (FILE *)(filep->access).fp, __stream != (FILE *)0x0)) {
    __s = workdata->buf;
    do {
      pcVar2 = fgets(__s,0x228,__stream);
      if (pcVar2 == (char *)0x0) {
        return 0;
      }
      sVar3 = strlen(__s);
      if (sVar3 != 0) {
        ppuVar4 = __ctype_b_loc();
        do {
          filep_00 = (mg_file *)(ulong)(*ppuVar4)[(byte)workdata->buf[sVar3 - 1]];
          if (((*ppuVar4)[(byte)workdata->buf[sVar3 - 1]] & 0x2002) == 0) {
            workdata->f_user = __s;
            if (workdata->buf[0] == ':') {
              if (workdata->buf[1] == '#') break;
              iVar1 = strncmp(workdata->buf + 1,"include=",8);
              pcVar6 = "%s: syntax error in authorization file: %s";
              pcVar2 = extraout_RDX;
              if (iVar1 == 0) {
                iVar1 = mg_fopen((mg_connection *)(workdata->buf + 9),(char *)0x1,(int)&local_80,
                                 filep_00);
                pcVar6 = "%s: cannot open authorization file: %s";
                pcVar2 = extraout_RDX_00;
                if (iVar1 != 0) {
                  iVar1 = read_auth_file(&local_80,workdata,depth + -1);
                  if ((FILE *)local_80.access.fp != (FILE *)0x0) {
                    fclose((FILE *)local_80.access.fp);
                  }
                  local_80.access.fp = (FILE *)0x0;
                  if (iVar1 != 0) {
                    return iVar1;
                  }
                  if (filep == (mg_file *)0x0) {
                    return 0;
                  }
                  goto LAB_0011ffee;
                }
              }
            }
            else {
              pcVar5 = strchr(__s,0x3a);
              workdata->f_domain = pcVar5;
              pcVar6 = "%s: syntax error in authorization file: %s";
              pcVar2 = extraout_RDX_01;
              if (pcVar5 != (char *)0x0) {
                *pcVar5 = '\0';
                pcVar2 = workdata->f_domain;
                workdata->f_domain = pcVar2 + 1;
                pcVar5 = strchr(pcVar2 + 1,0x3a);
                workdata->f_ha1 = pcVar5;
                pcVar6 = "%s: syntax error in authorization file: %s";
                pcVar2 = extraout_RDX_02;
                if (pcVar5 != (char *)0x0) {
                  *pcVar5 = '\0';
                  pcVar2 = workdata->f_ha1;
                  workdata->f_ha1 = pcVar2 + 1;
                  pcVar5 = workdata->f_user;
                  iVar1 = strcmp((workdata->ah).user,pcVar5);
                  if (iVar1 == 0) {
                    pcVar6 = workdata->domain;
                    iVar1 = strcmp(pcVar6,workdata->f_domain);
                    if (iVar1 == 0) {
                      iVar1 = (workdata->ah).type;
                      if (iVar1 == 2) {
                        iVar1 = check_password_digest
                                          ((workdata->conn->request_info).request_method,pcVar2 + 1,
                                           (workdata->ah).uri,(workdata->ah).nonce,(workdata->ah).nc
                                           ,(workdata->ah).cnonce,(workdata->ah).qop,
                                           (workdata->ah).response);
                        return iVar1;
                      }
                      if (iVar1 != 1) {
                        return 0;
                      }
                      mg_md5(local_58,pcVar5,":",pcVar6,":",(workdata->ah).plain_password,0);
                      iVar1 = bcmp(workdata->f_ha1,local_58,0x21);
                      return (uint)(iVar1 == 0);
                    }
                  }
                  break;
                }
              }
            }
            mg_cry_internal_wrap
                      (workdata->conn,(mg_context *)0x0,pcVar2,(uint)filep_00,pcVar6,
                       "read_auth_file",__s);
            break;
          }
          workdata->buf[sVar3 - 1] = '\0';
          sVar3 = sVar3 - 1;
        } while (sVar3 != 0);
      }
      if (filep == (mg_file *)0x0) {
        return 0;
      }
LAB_0011ffee:
      __stream = (FILE *)(filep->access).fp;
    } while (__stream != (FILE *)0x0);
  }
  return 0;
}

Assistant:

static int
read_auth_file(struct mg_file *filep,
               struct read_auth_file_struct *workdata,
               int depth)
{
	int is_authorized = 0;
	struct mg_file fp;
	size_t l;

	if (!filep || !workdata || (0 == depth)) {
		return 0;
	}

	/* Loop over passwords file */
	while (mg_fgets(workdata->buf, sizeof(workdata->buf), filep) != NULL) {
		l = strlen(workdata->buf);
		while (l > 0) {
			if (isspace((unsigned char)workdata->buf[l - 1])
			    || iscntrl((unsigned char)workdata->buf[l - 1])) {
				l--;
				workdata->buf[l] = 0;
			} else
				break;
		}
		if (l < 1) {
			continue;
		}

		workdata->f_user = workdata->buf;

		if (workdata->f_user[0] == ':') {
			/* user names may not contain a ':' and may not be empty,
			 * so lines starting with ':' may be used for a special purpose
			 */
			if (workdata->f_user[1] == '#') {
				/* :# is a comment */
				continue;
			} else if (!strncmp(workdata->f_user + 1, "include=", 8)) {
				if (mg_fopen(workdata->conn,
				             workdata->f_user + 9,
				             MG_FOPEN_MODE_READ,
				             &fp)) {
					is_authorized = read_auth_file(&fp, workdata, depth - 1);
					(void)mg_fclose(
					    &fp.access); /* ignore error on read only file */

					/* No need to continue processing files once we have a
					 * match, since nothing will reset it back
					 * to 0.
					 */
					if (is_authorized) {
						return is_authorized;
					}
				} else {
					mg_cry_internal(workdata->conn,
					                "%s: cannot open authorization file: %s",
					                __func__,
					                workdata->buf);
				}
				continue;
			}
			/* everything is invalid for the moment (might change in the
			 * future) */
			mg_cry_internal(workdata->conn,
			                "%s: syntax error in authorization file: %s",
			                __func__,
			                workdata->buf);
			continue;
		}

		workdata->f_domain = strchr(workdata->f_user, ':');
		if (workdata->f_domain == NULL) {
			mg_cry_internal(workdata->conn,
			                "%s: syntax error in authorization file: %s",
			                __func__,
			                workdata->buf);
			continue;
		}
		*(char *)(workdata->f_domain) = 0;
		(workdata->f_domain)++;

		workdata->f_ha1 = strchr(workdata->f_domain, ':');
		if (workdata->f_ha1 == NULL) {
			mg_cry_internal(workdata->conn,
			                "%s: syntax error in authorization file: %s",
			                __func__,
			                workdata->buf);
			continue;
		}
		*(char *)(workdata->f_ha1) = 0;
		(workdata->f_ha1)++;

		if (!strcmp(workdata->ah.user, workdata->f_user)
		    && !strcmp(workdata->domain, workdata->f_domain)) {
			switch (workdata->ah.type) {
			case 1: /* Basic */
			{
				char md5[33];
				mg_md5(md5,
				       workdata->f_user,
				       ":",
				       workdata->domain,
				       ":",
				       workdata->ah.plain_password,
				       NULL);
				return 0 == memcmp(workdata->f_ha1, md5, 33);
			}
			case 2: /* Digest */
				return check_password_digest(
				    workdata->conn->request_info.request_method,
				    workdata->f_ha1,
				    workdata->ah.uri,
				    workdata->ah.nonce,
				    workdata->ah.nc,
				    workdata->ah.cnonce,
				    workdata->ah.qop,
				    workdata->ah.response);
			default: /* None/Other/Unknown */
				return 0;
			}
		}
	}

	return is_authorized;
}